

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O0

ExpressionValue * __thiscall
ExpressionValue::operator&&
          (ExpressionValue *__return_storage_ptr__,ExpressionValue *this,ExpressionValue *other)

{
  ExpressionValueCombination EVar1;
  anon_union_8_2_b358304e_for_ExpressionValue_1 aVar2;
  bool local_4c;
  bool local_4b;
  bool local_4a;
  bool local_49;
  ExpressionValue *other_local;
  ExpressionValue *this_local;
  ExpressionValue *result;
  
  ExpressionValue(__return_storage_ptr__);
  __return_storage_ptr__->type = Integer;
  EVar1 = getValueCombination(this->type,other->type);
  switch(EVar1) {
  case II:
    local_49 = false;
    if ((this->field_1).intValue != 0) {
      local_49 = (other->field_1).intValue != 0;
    }
    aVar2.intValue._1_7_ = 0;
    aVar2.intValue._0_1_ = local_49;
    __return_storage_ptr__->field_1 = aVar2;
    break;
  case IF:
    local_4b = false;
    if ((this->field_1).intValue != 0) {
      local_4b = (other->field_1).floatValue != 0.0;
    }
    (__return_storage_ptr__->field_1).floatValue = (double)local_4b;
    break;
  default:
    break;
  case FI:
    local_4a = false;
    if (((this->field_1).floatValue != 0.0) || (NAN((this->field_1).floatValue))) {
      local_4a = (other->field_1).intValue != 0;
    }
    (__return_storage_ptr__->field_1).floatValue = (double)local_4a;
    break;
  case FF:
    local_4c = false;
    if (((this->field_1).floatValue != 0.0) || (NAN((this->field_1).floatValue))) {
      local_4c = (other->field_1).floatValue != 0.0;
    }
    (__return_storage_ptr__->field_1).floatValue = (double)local_4c;
  }
  return __return_storage_ptr__;
}

Assistant:

ExpressionValue ExpressionValue::operator&&(const ExpressionValue& other) const
{
	ExpressionValue result;
	result.type = ExpressionValueType::Integer;

	switch (getValueCombination(type,other.type))
	{
	case ExpressionValueCombination::II:
		result.intValue = intValue && other.intValue;
		break;
	case ExpressionValueCombination::FI:
		result.floatValue = floatValue && other.intValue;
		break;
	case ExpressionValueCombination::IF:
		result.floatValue = intValue && other.floatValue;
		break;
	case ExpressionValueCombination::FF:
		result.floatValue = floatValue && other.floatValue;
		break;
	default:
		break;
	}

	return result;
}